

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O0

int envy_bios_parse_cinema(envy_bios *bios)

{
  uint uVar1;
  uint uVar2;
  envy_bios_cinema *peVar3;
  int local_28;
  int wanthlen;
  int i;
  int err;
  envy_bios_cinema *cinema;
  envy_bios *bios_local;
  
  peVar3 = &bios->cinema;
  if (peVar3->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    uVar1 = bios_u8(bios,(uint)peVar3->offset,&(bios->cinema).version);
    uVar2 = bios_u8(bios,peVar3->offset + 1,&(bios->cinema).hlen);
    wanthlen = uVar2 | uVar1;
    for (local_28 = 0; local_28 < 10; local_28 = local_28 + 1) {
      uVar1 = bios_u8(bios,peVar3->offset + 2 + local_28,(bios->cinema).unk02 + local_28);
      wanthlen = uVar1 | wanthlen;
    }
    if (wanthlen == 0) {
      envy_bios_block(bios,(uint)peVar3->offset,(uint)(bios->cinema).hlen,"CINEMA",-1);
      uVar1 = (uint)(bios->cinema).version;
      if ((uVar1 - 0x30 < 2) || (uVar1 == 0x40)) {
        if ((bios->cinema).hlen < 0xc) {
          fprintf(_stderr,"CINEMA table header too short [%d < %d]\n",(ulong)(bios->cinema).hlen,0xc
                 );
          bios_local._4_4_ = -0x16;
        }
        else {
          if (0xc < (bios->cinema).hlen) {
            fprintf(_stderr,"CINEMA table header longer than expected [%d > %d]\n",
                    (ulong)(bios->cinema).hlen,0xc);
          }
          (bios->cinema).valid = '\x01';
          bios_local._4_4_ = 0;
        }
      }
      else {
        fprintf(_stderr,"Unknown CINEMA table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->cinema).version >> 4),
                (ulong)((bios->cinema).version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_cinema (struct envy_bios *bios) {
	struct envy_bios_cinema *cinema = &bios->cinema;
	if (!cinema->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, cinema->offset, &cinema->version);
	err |= bios_u8(bios, cinema->offset+1, &cinema->hlen);
	int i;
	for (i = 0; i < 10; i++)
		err |= bios_u8(bios, cinema->offset+2+i, &cinema->unk02[i]);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, cinema->offset, cinema->hlen, "CINEMA", -1);
	int wanthlen = 0;
	switch (cinema->version) {
		case 0x30:
		case 0x31:
		case 0x40:
			wanthlen = 12;
			break;
		default:
			ENVY_BIOS_ERR("Unknown CINEMA table version %d.%d\n", cinema->version >> 4, cinema->version & 0xf);
			return -EINVAL;
	}
	if (cinema->hlen < wanthlen) {
		ENVY_BIOS_ERR("CINEMA table header too short [%d < %d]\n", cinema->hlen, wanthlen);
		return -EINVAL;
	}
	if (cinema->hlen > wanthlen) {
		ENVY_BIOS_WARN("CINEMA table header longer than expected [%d > %d]\n", cinema->hlen, wanthlen);
	}
	cinema->valid = 1;
	return 0;
}